

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

void __thiscall mp::NLFeeder_Easy::PermuteVars(NLFeeder_Easy *this)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  int *piVar4;
  _Bit_type *p_Var5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __seed;
  int iVar10;
  int iVar11;
  ulong uVar12;
  pair<int,_int> *ppVar13;
  int local_5c;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::pair<int,_int>_>
  local_48;
  
  pdVar2 = (this->nlme_).vars_.lower_;
  pdVar3 = (this->nlme_).vars_.upper_;
  piVar4 = (this->nlme_).vars_.type_;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            (&this->var_perm_,(long)(this->nlme_).vars_.num_col_);
  __seed._M_current =
       (this->var_perm_).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  ppVar13 = (this->var_perm_).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = (long)ppVar13 - (long)__seed._M_current >> 3;
  if (ppVar13 != __seed._M_current) {
    p_Var5 = (this->nlv_obj_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_5c = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_binary_vars;
    iVar10 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_integer_vars;
    iVar11 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_objs;
    uVar12 = uVar8;
    do {
      uVar9 = uVar12 - 1;
      uVar12 = uVar12 + 0x3e;
      if (-1 < (long)uVar9) {
        uVar12 = uVar9;
      }
      uVar12 = 1L << ((byte)uVar9 & 0x3f) &
               p_Var5[((long)uVar12 >> 6) +
                      (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff];
      uVar6 = (uint)(uVar12 != 0) * -2;
      __seed._M_current[uVar9].first = uVar6;
      __seed._M_current[uVar9].second = (int)uVar9;
      if ((piVar4 != (int *)0x0) && (piVar4[uVar9] != 0)) {
        __seed._M_current[uVar9].first = uVar6 | 1;
        if (uVar12 == 0) {
          dVar1 = pdVar2[uVar9];
          if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar1 = pdVar3[uVar9], dVar1 != 1.0)) ||
             (NAN(dVar1))) {
            __seed._M_current[uVar9].first = uVar6 + 2;
            iVar10 = iVar10 + 1;
            (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_integer_vars =
                 iVar10;
          }
          else {
            local_5c = local_5c + 1;
            (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_binary_vars =
                 local_5c;
          }
        }
        else {
          iVar11 = iVar11 + 1;
          (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_objs =
               iVar11;
        }
      }
      uVar12 = uVar9;
    } while (uVar9 != 0);
    if (ppVar13 != __seed._M_current) {
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::pair<int,_int>_>
      ::_Temporary_buffer(&local_48,__seed,(long)((uVar8 - ((long)(uVar8 + 1) >> 0x3f)) + 1) >> 1);
      if (local_48._M_buffer == (pointer)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (__seed._M_current,ppVar13);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (__seed._M_current,ppVar13,local_48._M_buffer,local_48._M_len);
      }
      operator_delete(local_48._M_buffer,local_48._M_len << 3);
      __seed._M_current =
           (this->var_perm_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
      ppVar13 = (this->var_perm_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar8 = (long)ppVar13 - (long)__seed._M_current >> 3;
    }
  }
  if (ppVar13 != __seed._M_current) {
    do {
      lVar7 = uVar8 - 1;
      uVar8 = uVar8 - 1;
      __seed._M_current[__seed._M_current[lVar7].second].first = (int)uVar8;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

void PermuteVars() {
    auto vars = NLME().ColData();
    var_perm_.resize(NLME().NumCols());
    assert(nlv_obj_.size());               // was filled
    for (auto i=var_perm_.size(); i--; ) {
      var_perm_[i] = {-2*(int)nlv_obj_[i], i};  // Prioritize nonlinear
      if (vars.type_ && vars.type_[i]) {        // int var
        ++var_perm_[i].first;
        if (nlv_obj_[i])
          ++header_.num_nl_integer_vars_in_objs; // STATS
        else {
          if (0.0!=std::fabs(vars.lower_[i]) || 1.0!=vars.upper_[i]) {
            ++var_perm_[i].first;           // For linear, first binary
            ++header_.num_linear_integer_vars;   // STATS
          } else
            ++header_.num_linear_binary_vars;    // STATS
        }
      }
    }
    // Could just shove apart in linear time @todo
    std::stable_sort(var_perm_.begin(), var_perm_.end());
    // Create reverse mapping
    for (auto i=var_perm_.size(); i--; )
      var_perm_[var_perm_[i].second].first = i;
  }